

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrCore.c
# Opt level: O2

void Pdr_ManSetDefaultParams(Pdr_Par_t *pPars)

{
  memset(&pPars->nTimeOutGap,0,0xa0);
  pPars->nRecycle = 300;
  pPars->nFrameMax = 10000;
  pPars->nConfLimit = 0;
  pPars->nConfGenLimit = 0;
  pPars->nRestLimit = 0;
  pPars->nTimeOut = 0;
  pPars->nTimeOutGap = 0;
  pPars->nRandomSeed = 0x57670fd;
  pPars->fFlopOrder = 0;
  pPars->fDumpInv = 0;
  pPars->fTwoRounds = 0;
  pPars->fMonoCnf = 0;
  pPars->fNewXSim = 0;
  pPars->fFlopPrio = 0;
  pPars->fUseSupp = 1;
  pPars->fUsePropOut = 1;
  pPars->fSkipDown = 1;
  pPars->fVeryVerbose = 0;
  pPars->fNotVerbose = 0;
  pPars->fCtgs = 0;
  pPars->fUseAbs = 0;
  pPars->fUseSimpleRef = 0;
  pPars->fVerbose = 0;
  pPars->iFrame = -1;
  pPars->nDropOuts = 0;
  pPars->pInvFileName = (char *)0x0;
  return;
}

Assistant:

void Pdr_ManSetDefaultParams( Pdr_Par_t * pPars )
{
    memset( pPars, 0, sizeof(Pdr_Par_t) );
//    pPars->iOutput        =      -1;  // zero-based output number
    pPars->nRecycle       =     300;  // limit on vars for recycling
    pPars->nFrameMax      =   10000;  // limit on number of timeframes
    pPars->nTimeOut       =       0;  // timeout in seconds
    pPars->nTimeOutGap    =       0;  // timeout in seconds since the last solved
    pPars->nConfLimit     =       0;  // limit on SAT solver conflicts
    pPars->nConfGenLimit  =       0;  // limit on SAT solver conflicts during generalization
    pPars->nRestLimit     =       0;  // limit on the number of proof-obligations
    pPars->nRandomSeed   = 91648253;  // value to seed the SAT solver with
    pPars->fTwoRounds     =       0;  // use two rounds for generalization
    pPars->fMonoCnf       =       0;  // monolythic CNF
    pPars->fNewXSim       =       0;  // updated X-valued simulation
    pPars->fFlopPrio      =       0;  // use structural flop priorities
    pPars->fFlopOrder     =       0;  // order flops for 'analyze_final' during generalization
    pPars->fDumpInv       =       0;  // dump inductive invariant
    pPars->fUseSupp       =       1;  // using support variables in the invariant
    pPars->fShortest      =       0;  // forces bug traces to be shortest
    pPars->fUsePropOut    =       1;  // use property output
    pPars->fSkipDown      =       1;  // apply down in generalization
    pPars->fCtgs          =       0;  // handle CTGs in down
    pPars->fUseAbs        =       0;  // use abstraction 
    pPars->fUseSimpleRef  =       0;  // simplified CEX refinement
    pPars->fVerbose       =       0;  // verbose output
    pPars->fVeryVerbose   =       0;  // very verbose output
    pPars->fNotVerbose    =       0;  // not printing line-by-line progress
    pPars->iFrame         =      -1;  // explored up to this frame
    pPars->nFailOuts      =       0;  // the number of disproved outputs
    pPars->nDropOuts      =       0;  // the number of timed out outputs
    pPars->timeLastSolved =       0;  // last one solved
    pPars->pInvFileName   =    NULL;  // invariant file name
}